

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

SuspendedRequest * __thiscall
kj::_::NullableValue<kj::HttpServer::SuspendedRequest>::emplace<kj::HttpServer::SuspendedRequest>
          (NullableValue<kj::HttpServer::SuspendedRequest> *this,SuspendedRequest *params)

{
  SuspendedRequest *params_00;
  SuspendedRequest *params_local;
  NullableValue<kj::HttpServer::SuspendedRequest> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::HttpServer::SuspendedRequest>(&(this->field_1).value);
  }
  params_00 = fwd<kj::HttpServer::SuspendedRequest>(params);
  ctor<kj::HttpServer::SuspendedRequest,kj::HttpServer::SuspendedRequest>
            (&(this->field_1).value,params_00);
  this->isSet = true;
  return (SuspendedRequest *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }